

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O0

void Memory::RecyclerWriteBarrierManager::WriteBarrier(void *address,size_t bytes)

{
  code *pcVar1;
  bool bVar2;
  uintptr_t uVar3;
  void *address_00;
  uintptr_t uVar4;
  undefined8 *in_FS_OFFSET;
  uintptr_t endIndex;
  char *endAddress;
  uintptr_t startIndex;
  size_t bytes_local;
  void *address_local;
  
  VerifyIsBarrierAddress(address,bytes);
  uVar3 = GetCardTableIndex(address);
  address_00 = (void *)Math::Align<long>((long)address + bytes,0x1000);
  uVar4 = GetCardTableIndex(address_00);
  if (uVar4 < uVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                       ,0x16a,"(startIndex <= endIndex)","startIndex <= endIndex");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  memset(cardTable + uVar3,3,uVar4 - uVar3);
  if (((Js::Configuration::Global[0x291a2] & 1) != 0) &&
     (bVar2 = Js::Phases::IsEnabled
                        ((Phases *)(Js::Configuration::Global + 0x23450),MemoryAllocationPhase),
     bVar2)) {
    Output::Print(L"Writing to 0x%p (CIndex: %u-%u)\n",address,uVar3,uVar4);
  }
  return;
}

Assistant:

void
RecyclerWriteBarrierManager::WriteBarrier(void * address, size_t bytes)
{
    if (IS_ASAN_FAKE_STACK_ADDR(address))
    {
        return;
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    VerifyIsBarrierAddress(address, bytes);
#endif
#ifdef RECYCLER_WRITE_BARRIER_BYTE
    uintptr_t startIndex = GetCardTableIndex(address);
    char * endAddress = (char *)Math::Align<INT_PTR>((INT_PTR)((char *)address + bytes), s_WriteBarrierPageSize);
    uintptr_t endIndex = GetCardTableIndex(endAddress);
    Assert(startIndex <= endIndex);
    memset(cardTable + startIndex, WRITE_BARRIER_PAGE_BIT | DIRTYBIT, endIndex - startIndex);
    GlobalSwbVerboseTrace(_u("Writing to 0x%p (CIndex: %u-%u)\n"), address, startIndex, endIndex);

#else
    uint bitShift = (((uint)address) >> s_BitArrayCardTableShift);
    uint bitMask = 0xFFFFFFFF << bitShift;
    uint cardIndex = ((uint)address) / s_BytesPerCard);

    char * endAddress = (char *)Math::Align((INT_PTR)((char *)address + bytes), s_BytesPerCardBit);
    char * alignedAddress = (char *)Math::Align((INT_PTR)address, s_WriteBarrierPageSize);
    if (alignedAddress > endAddress)
    {
        uint endAddressShift = (((uint)endAddress) >> s_BitArrayCardTableShift);
        uint endAddressBitMask = 0xFFFFFFFF << endAddressShift;
        bitMask &= ~endAddressBitMask;
        cardTable[cardIndex] |= bitMask;
        return;
    }
    cardTable[cardIndex] |= bitMask;

    size_t remainingBytes = endAddress - alignedAddress;
    size_t fullMaskCount = remainingBytes  / g_WriteBarrierPageSize;
    memset(&cardTable[cardIndex + 1], 0xFFFFFFFF, fullMaskCount * sizeof(DWORD));

    uint endAddressShift = (((uint)endAddress) >> s_BitArrayCardTableShift);
    uint endAddressBitMask = 0xFFFFFFFF << endAddressShift;
    cardTable[cardIndex + 1 + fullMaskCount] |= ~endAddressBitMask;
#endif
}